

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  int k;
  bool bVar1;
  int r_size;
  bool bVar2;
  int iVar3;
  undefined1 local_78 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_68;
  int *local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
  bVar2 = false;
  local_3c = theta;
  local_48 = delta;
  local_54 = kappa;
  local_60 = last._M_current;
  for (; first._M_current != local_60; first._M_current = first._M_current + 1) {
    k = *first._M_current;
    sparse_matrix<int>::row
              ((sparse_matrix<int> *)local_78,
               (int)local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl);
    solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,local_3c);
    r_size = solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                         *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
              (*(rc_data **)(this + 0x58),*(rc_data **)(this + 0x58) + r_size,
               *(random_engine **)(this + 8));
    iVar3 = *(int *)(*(long *)(this + 0x60) + (long)k * 4);
    if (r_size < iVar3) {
      iVar3 = r_size;
    }
    bVar1 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                        *)this,x,(row_value *)local_78._8_8_,k,iVar3 + -1,r_size,local_54,local_48);
    bVar2 = (bool)(bVar2 | bVar1);
  }
  return bVar2;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }